

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

TValue * luaH_getstr(Table *t,TString *key)

{
  Node *n;
  byte bVar1;
  TString *pTVar2;
  TValue *pTVar3;
  uint uVar4;
  char *pcVar5;
  TValue ko;
  
  bVar1 = key->tt;
  if (bVar1 != 4) {
    if ((bVar1 & 0xe) < 10) {
      ko.tt_ = bVar1 | 0x8000;
      ko.value_ = (Value)key;
      if (-1 < (char)bVar1) {
        pTVar3 = getgeneric(t,&ko);
        return pTVar3;
      }
      pcVar5 = "0";
    }
    else {
      pcVar5 = "(((x_)->tt) & 0x0F) < (9+1)";
    }
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                  ,0x2ae,"const TValue *luaH_getstr(Table *, TString *)");
  }
  uVar4 = t->hmask & key->hash;
  n = t->node + uVar4;
  if (t->node[uVar4].i_key.nk.tt_ != 0x8004) {
LAB_0012051b:
    if ((n->i_key).nk.next == 0) {
      return &luaO_nilobject_;
    }
    pTVar3 = luaH_getshortstr_continue(key,n);
    return pTVar3;
  }
  pTVar2 = (TString *)(n->i_key).nk.value_.gc;
  bVar1 = pTVar2->tt;
  if ((bVar1 & 0xf) == 4) {
    if (bVar1 == 4) {
      if (pTVar2 == key) {
        return &n->i_val;
      }
      goto LAB_0012051b;
    }
    pcVar5 = 
    "((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
    ;
  }
  else {
    pcVar5 = "(((((k)->value_).gc)->tt) & 0x0F) == 4";
  }
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
}

Assistant:

const TValue *luaH_getstr (Table *t, TString *key) {
  if (key->tt == LUA_TSHRSTR)
    return luaH_getshortstr(t, key);
  else {  /* for long strings, use generic case */
    TValue ko;
    setsvalue(cast(lua_State *, NULL), &ko, key);
    return getgeneric(t, &ko);
  }
}